

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O1

bool tinyusdz::LoadUSDCFromFile
               (string *_filename,Stage *stage,string *warn,string *err,USDLoadOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  ulong *puVar4;
  char *__lhs;
  ulong uVar5;
  string *psVar6;
  _Alloc_hider _Var7;
  string _err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  MMapFileHandle handle;
  string filepath;
  string local_c8;
  undefined1 local_a8 [32];
  MMapFileHandle local_88;
  string local_50;
  
  io::ExpandFilePath(&local_50,(string *)_filename,(void *)0x0);
  bVar2 = io::IsMMapSupported();
  if (bVar2) {
    local_88.filename._M_dataplus._M_p = (pointer)&local_88.filename.field_2;
    local_88.filename._M_string_length = 0;
    local_88.filename.field_2._M_allocated_capacity =
         local_88.filename.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_88.writable = false;
    local_88.addr = (uint8_t *)0x0;
    local_88.size = 0;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    bVar2 = io::MMapFile(&local_50,&local_88,false,&local_c8);
    if (bVar2) {
      if (warn != (string *)0x0 && local_c8._M_string_length != 0) {
        local_a8._0_8_ = local_a8 + 0x10;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a8,local_c8._M_dataplus._M_p,
                   local_c8._M_dataplus._M_p + local_c8._M_string_length);
        ::std::__cxx11::string::append((char *)local_a8);
        psVar6 = warn;
LAB_0012387a:
        ::std::__cxx11::string::_M_append((char *)psVar6,local_a8._0_8_);
        if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
        }
      }
    }
    else if (err != (string *)0x0) {
      local_a8._0_8_ = local_a8 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,local_c8._M_dataplus._M_p,
                 local_c8._M_dataplus._M_p + local_c8._M_string_length);
      ::std::__cxx11::string::append((char *)local_a8);
      psVar6 = err;
      goto LAB_0012387a;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2) {
      bVar2 = LoadUSDCFromMemory(local_88.addr,local_88.size,(string *)&local_50,stage,warn,err,
                                 options);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      io::UnmapFile(&local_88,&local_c8);
      if (warn != (string *)0x0 && local_c8._M_string_length != 0) {
        local_a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_a8 + 0x10);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a8,local_c8._M_dataplus._M_p,
                   local_c8._M_dataplus._M_p + local_c8._M_string_length);
        ::std::__cxx11::string::append((char *)local_a8);
        ::std::__cxx11::string::_M_append((char *)warn,local_a8._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.filename._M_dataplus._M_p == &local_88.filename.field_2) goto LAB_00123aa8;
    uVar5 = local_88.filename.field_2._M_allocated_capacity + 1;
    _Var7._M_p = local_88.filename._M_dataplus._M_p;
  }
  else {
    local_a8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_a8._8_8_ = (pointer)0x0;
    local_a8._16_8_ = (pointer)0x0;
    bVar2 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8,
                              (string *)err,&local_50,(long)options->max_memory_limit_in_mb << 0x14,
                              (void *)0x0);
    if (bVar2) {
      if ((ulong)(local_a8._8_8_ - local_a8._0_8_) < 0x58) {
        if (err != (string *)0x0) {
          __lhs = "File size too short. Looks like this file is not a USDC : \"";
          goto LAB_001239a1;
        }
        goto LAB_00123a8f;
      }
      bVar2 = LoadUSDCFromMemory((uint8_t *)local_a8._0_8_,local_a8._8_8_ - local_a8._0_8_,
                                 (string *)&local_50,stage,warn,err,options);
    }
    else {
      if (err != (string *)0x0) {
        __lhs = "File not found or failed to read : \"";
LAB_001239a1:
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_c8,__lhs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_50);
        plVar3 = (long *)::std::__cxx11::string::append((char *)&local_c8);
        paVar1 = &local_88.filename.field_2;
        puVar4 = (ulong *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar4) {
          local_88.filename.field_2._M_allocated_capacity = *puVar4;
          local_88.filename.field_2._8_8_ = plVar3[3];
          local_88.filename._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_88.filename.field_2._M_allocated_capacity = *puVar4;
          local_88.filename._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_88.filename._M_string_length = plVar3[1];
        *plVar3 = (long)puVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_88.filename._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.filename._M_dataplus._M_p != paVar1) {
          operator_delete(local_88.filename._M_dataplus._M_p,
                          local_88.filename.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                   local_c8.field_2._M_local_buf[0]) + 1);
        }
      }
LAB_00123a8f:
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_00123aa8;
    uVar5 = local_a8._16_8_ - local_a8._0_8_;
    _Var7._M_p = (pointer)local_a8._0_8_;
  }
  operator_delete(_Var7._M_p,uVar5);
LAB_00123aa8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool LoadUSDCFromFile(const std::string &_filename, Stage *stage,
                      std::string *warn, std::string *err,
                      const USDLoadOptions &options) {
  std::string filepath = io::ExpandFilePath(_filename, /* userdata */ nullptr);

  if (io::IsMMapSupported()) {
    io::MMapFileHandle handle;
    
    {
      std::string _err;
      if (!io::MMapFile(filepath, &handle, /* writable */false, &_err)) {
        if (err) {
          (*err) += _err + "\n";
        }
        return false; 
      }

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    bool ret = LoadUSDCFromMemory(handle.addr, size_t(handle.size), filepath, stage, warn,
                              err, options);

    {
      std::string _err;
      // Ignore unmap result for now.
      io::UnmapFile(handle, &_err);

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    return ret;

  } else {
    std::vector<uint8_t> data;
    size_t max_bytes = 1024 * 1024 * size_t(options.max_memory_limit_in_mb);
    if (!io::ReadWholeFile(&data, err, filepath, max_bytes,
                           /* userdata */ nullptr)) {
      if (err) {
        (*err) += "File not found or failed to read : \"" + filepath + "\"\n";
      }

      return false;
    }

    DCOUT("File size: " + std::to_string(data.size()) + " bytes.");

    if (data.size() < (11 * 8)) {
      // ???
      if (err) {
        (*err) += "File size too short. Looks like this file is not a USDC : \"" +
                  filepath + "\"\n";
      }
      return false;
    }

    return LoadUSDCFromMemory(data.data(), data.size(), filepath, stage, warn,
                              err, options);
  }
}